

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlif.c
# Opt level: O2

Abc_Ntk_t * Io_ReadBlif(char *pFileName,int fCheck)

{
  anon_union_4_2_947302e2 v_1;
  int iVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  Extra_FileReader_t *pEVar5;
  Io_ReadBlif_t *p;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  Vec_Str_t *pVVar8;
  char *pcVar9;
  Vec_Int_t *pVVar10;
  Abc_Ntk_t *pAVar11;
  Abc_Ntk_t *pNtk;
  anon_union_4_2_947302e2 v;
  anon_union_4_2_947302e2 v_2;
  Abc_Ntk_t *pNtk_00;
  
  pEVar5 = Extra_FileReaderAlloc(pFileName,"#","\n\r"," \t");
  if (pEVar5 == (Extra_FileReader_t *)0x0) {
    return (Abc_Ntk_t *)0x0;
  }
  p = (Io_ReadBlif_t *)calloc(1,0x488);
  p->pFileName = pFileName;
  p->pReader = pEVar5;
  p->Output = _stdout;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  iVar1 = 100;
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  ppvVar7 = (void **)malloc(800);
  pVVar6->pArray = ppvVar7;
  p->vNewTokens = pVVar6;
  pVVar8 = (Vec_Str_t *)malloc(0x10);
  pVVar8->nCap = 100;
  pVVar8->nSize = 0;
  pcVar9 = (char *)malloc(100);
  pVVar8->pArray = pcVar9;
  p->vCubes = pVVar8;
  pVVar10 = Vec_IntAlloc(iVar1);
  p->vInArrs = pVVar10;
  pVVar10 = Vec_IntAlloc(iVar1);
  p->vOutReqs = pVVar10;
  pVVar10 = Vec_IntAlloc(iVar1);
  p->vInDrives = pVVar10;
  pVVar10 = Vec_IntAlloc(iVar1);
  p->vOutLoads = pVVar10;
  pVVar6 = Io_ReadBlifGetTokens(p);
  p->vTokens = pVVar6;
  if ((pVVar6 != (Vec_Ptr_t *)0x0) && (iVar1 = strcmp((char *)*pVVar6->pArray,".model"), iVar1 == 0)
     ) {
    pNtk_00 = (Abc_Ntk_t *)0x0;
    do {
      if ((p->vTokens == (Vec_Ptr_t *)0x0) ||
         (pAVar11 = Io_ReadBlifNetworkOne(p), pAVar11 == (Abc_Ntk_t *)0x0)) goto LAB_0069e867;
      if ((p->vTokens != (Vec_Ptr_t *)0x0) &&
         (iVar1 = strcmp((char *)*p->vTokens->pArray,".exdc"), iVar1 == 0)) {
        pNtk = Io_ReadBlifNetworkOne(p);
        pAVar11->pExdc = pNtk;
        if (pNtk == (Abc_Ntk_t *)0x0) goto LAB_0069e867;
        Abc_NtkFinalizeRead(pNtk);
      }
      if (pNtk_00 == (Abc_Ntk_t *)0x0) {
        p->pNtkMaster = pAVar11;
        pNtk_00 = pAVar11;
      }
    } while( true );
  }
  builtin_strncpy(p->sError,"Wrong input file format.",0x19);
  Io_ReadBlifPrintErrorMessage(p);
LAB_0069e7e3:
  Io_ReadBlifFree(p);
  return (Abc_Ntk_t *)0x0;
LAB_0069e867:
  if (p->fError == 0) {
    Abc_NtkFinalizeRead(pNtk_00);
  }
  if (pNtk_00 != (Abc_Ntk_t *)0x0) {
    pcVar9 = Extra_UtilStrsav(pFileName);
    pNtk_00->pSpec = pcVar9;
    if (p->fHaveDefInArr != 0) {
      Abc_NtkTimeSetDefaultArrival(pNtk_00,p->DefInArrRise,p->DefInArrFall);
    }
    if (p->fHaveDefOutReq != 0) {
      Abc_NtkTimeSetDefaultRequired(pNtk_00,p->DefOutReqRise,p->DefOutReqFall);
    }
    if (p->fHaveDefInDri != 0) {
      Abc_NtkTimeSetDefaultInputDrive(pNtk_00,p->DefInDriRise,p->DefInDriFall);
    }
    if (p->fHaveDefOutLoad != 0) {
      Abc_NtkTimeSetDefaultOutputLoad(pNtk_00,p->DefOutLoadRise,p->DefOutLoadFall);
    }
    iVar1 = 1;
    while( true ) {
      if (p->vInArrs->nSize <= iVar1 + 1) break;
      iVar2 = Vec_IntEntry(p->vInArrs,iVar1 + -1);
      fVar3 = (float)Vec_IntEntry(p->vInArrs,iVar1);
      fVar4 = (float)Vec_IntEntry(p->vInArrs,iVar1 + 1);
      Abc_NtkTimeSetArrival(pNtk_00,iVar2,fVar3,fVar4);
      iVar1 = iVar1 + 3;
    }
    iVar1 = 1;
    while( true ) {
      if (p->vOutReqs->nSize <= iVar1 + 1) break;
      iVar2 = Vec_IntEntry(p->vOutReqs,iVar1 + -1);
      fVar3 = (float)Vec_IntEntry(p->vOutReqs,iVar1);
      fVar4 = (float)Vec_IntEntry(p->vOutReqs,iVar1 + 1);
      Abc_NtkTimeSetRequired(pNtk_00,iVar2,fVar3,fVar4);
      iVar1 = iVar1 + 3;
    }
    iVar1 = 1;
    while( true ) {
      if (p->vInDrives->nSize <= iVar1 + 1) break;
      iVar2 = Vec_IntEntry(p->vInDrives,iVar1 + -1);
      fVar3 = (float)Vec_IntEntry(p->vInDrives,iVar1);
      fVar4 = (float)Vec_IntEntry(p->vInDrives,iVar1 + 1);
      Abc_NtkTimeSetInputDrive(pNtk_00,iVar2,fVar3,fVar4);
      iVar1 = iVar1 + 3;
    }
    iVar1 = 1;
    while( true ) {
      if (p->vOutLoads->nSize <= iVar1 + 1) break;
      iVar2 = Vec_IntEntry(p->vOutLoads,iVar1 + -1);
      fVar3 = (float)Vec_IntEntry(p->vOutLoads,iVar1);
      fVar4 = (float)Vec_IntEntry(p->vOutLoads,iVar1 + 1);
      Abc_NtkTimeSetOutputLoad(pNtk_00,iVar2,fVar3,fVar4);
      iVar1 = iVar1 + 3;
    }
    Io_ReadBlifFree(p);
    if (fCheck != 0) {
      iVar1 = Abc_NtkCheckRead(pNtk_00);
      if (iVar1 == 0) {
        puts("Io_ReadBlif: The network check has failed.");
        Abc_NtkDelete(pNtk_00);
        return (Abc_Ntk_t *)0x0;
      }
      return pNtk_00;
    }
    return pNtk_00;
  }
  goto LAB_0069e7e3;
}

Assistant:

Abc_Ntk_t * Io_ReadBlif( char * pFileName, int fCheck )
{
    Io_ReadBlif_t * p;
    Abc_Ntk_t * pNtk;

    // start the file
    p = Io_ReadBlifFile( pFileName );
    if ( p == NULL )
        return NULL;

    // read the hierarchical network
    pNtk = Io_ReadBlifNetwork( p );
    if ( pNtk == NULL )
    {
        Io_ReadBlifFree( p );
        return NULL;
    }
    pNtk->pSpec = Extra_UtilStrsav( pFileName );
    Io_ReadBlifCreateTiming( p, pNtk );
    Io_ReadBlifFree( p );

    // make sure that everything is okay with the network structure
    if ( fCheck && !Abc_NtkCheckRead( pNtk ) )
    {
        printf( "Io_ReadBlif: The network check has failed.\n" );
        Abc_NtkDelete( pNtk );
        return NULL;
    }
    return pNtk;
}